

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O3

void __thiscall GmmLib::GmmPageTableMgr::~GmmPageTableMgr(GmmPageTableMgr *this)

{
  GMM_PAGETABLEPool *this_00;
  AuxTable *pAVar1;
  
  this->_vptr_GmmPageTableMgr = (_func_int **)&PTR_GetAuxL3TableAddr_001c7be0;
  if (this->pClientContext != (GmmClientContext *)0x0) {
    (*this->pClientContext->_vptr_GmmClientContext[2])();
  }
  this_00 = this->pPool;
  if (this_00 != (GMM_PAGETABLEPool *)0x0) {
    if (this->AuxTTObj != (AuxTable *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&this->PoolLock);
      this_00 = this->pPool;
    }
    GmmPageTablePool::__DestroyPageTablePool(this_00,&this->DeviceCbInt,this->hCsr);
    this->NumNodePoolElements = 0;
    if (this->AuxTTObj != (AuxTable *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->PoolLock);
    }
  }
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)&this->PoolLock);
    pAVar1 = this->AuxTTObj;
    if (pAVar1 != (AuxTable *)0x0) {
      if (pAVar1->NullL1Table != (Table *)0x0) {
        operator_delete(pAVar1->NullL1Table);
        pAVar1 = this->AuxTTObj;
      }
      if (pAVar1->NullL2Table != (Table *)0x0) {
        operator_delete(pAVar1->NullL2Table);
        pAVar1 = this->AuxTTObj;
      }
      PageTable::DestroyL3Table(&pAVar1->super_PageTable);
      pAVar1 = this->AuxTTObj;
      if (pAVar1 != (AuxTable *)0x0) {
        PageTable::~PageTable(&pAVar1->super_PageTable);
        free(pAVar1);
      }
      this->AuxTTObj = (AuxTable *)0x0;
    }
  }
  return;
}

Assistant:

GmmLib::GmmPageTableMgr::~GmmPageTableMgr()
{
    GMM_CLIENT ClientType;

    GET_GMM_CLIENT_TYPE(pClientContext, ClientType);



    if(pPool)
    {
        ENTER_CRITICAL_SECTION
        pPool->__DestroyPageTablePool(&DeviceCbInt, hCsr);
        NumNodePoolElements = 0;
        EXIT_CRITICAL_SECTION
    }

    if(AuxTTObj)
    {
        DeleteCriticalSection(&PoolLock);

        if(AuxTTObj)
        {
            if(AuxTTObj->NullL1Table)
            {
                delete AuxTTObj->NullL1Table;
            }
            if(AuxTTObj->NullL2Table)
            {
                delete AuxTTObj->NullL2Table;
            }
            AuxTTObj->DestroyL3Table();
            delete AuxTTObj;
            AuxTTObj = NULL;
        }
    }
}